

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

string * nonius::detail::units_for_magnitude_abi_cxx11_(double magnitude)

{
  string *in_RDI;
  double in_XMM0_Qa;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  if (1.0 < in_XMM0_Qa) {
    if (1000.0 < in_XMM0_Qa) {
      if (1000000.0 < in_XMM0_Qa) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"ns",&local_27);
        std::allocator<char>::~allocator((allocator<char> *)&local_27);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,anon_var_dwarf_60cfc,&local_26);
        std::allocator<char>::~allocator((allocator<char> *)&local_26);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"ms",local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"s",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

inline std::string units_for_magnitude(double magnitude) {
            if(magnitude <= 1.e0) return "s";
            else if(magnitude <= 1.e3) return "ms";
            else if(magnitude <= 1.e6) return "μs";
            else return "ns";
        }